

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int fits_translate_pixkeyword
              (char *inrec,char *outrec,char *(*patterns) [2],int npat,int naxis,int *colnum,
              int *pat_num,int *i,int *j,int *n,int *m,int *l,int *status)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  ushort **ppuVar11;
  int iVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  byte *pbVar18;
  long lVar19;
  long lVar20;
  byte bVar21;
  bool bVar22;
  int local_90;
  int local_8c;
  uint local_88;
  int local_84;
  int local_80;
  uint local_74;
  
  iVar16 = *status;
  if (*status < 1) {
    if (inrec == (char *)0x0 || outrec == (char *)0x0) {
      *status = 0x73;
      iVar16 = 0x73;
    }
    else {
      *outrec = '\0';
      if (*inrec == '\0') {
        iVar16 = 0;
      }
      else {
        if (npat < 1) {
          bVar4 = true;
          bVar21 = 0x20;
          local_88 = 0;
          local_8c = 0;
          local_90 = 0;
          local_80 = 0;
          local_84 = 0;
          local_74 = 0;
        }
        else {
          uVar13 = 0;
          bVar5 = false;
          bVar7 = 0;
          local_74 = 0;
          local_84 = 0;
          local_80 = 0;
          do {
            pbVar18 = (byte *)patterns[uVar13][0];
            bVar1 = *pbVar18;
            local_88 = (uint)uVar13;
            if (bVar1 == 0x2a) {
              bVar4 = true;
              bVar21 = 0x20;
              local_8c = 0;
              local_90 = 0;
              break;
            }
            if ((bVar5) && (bVar1 == bVar7)) {
              local_8c = 0;
              bVar5 = true;
              bVar21 = 0x20;
              local_90 = 0;
              bVar4 = false;
            }
            else {
              bVar7 = *pbVar18;
              bVar4 = false;
              if (bVar7 == 0) {
                bVar22 = true;
                bVar21 = 0x20;
                bVar5 = true;
                local_8c = 0;
                local_90 = 0;
                iVar16 = 0;
              }
              else {
                bVar21 = 0x20;
                lVar17 = 0;
                bVar5 = true;
                bVar6 = false;
                iVar16 = 0;
                local_90 = 0;
                local_8c = 0;
                do {
                  lVar19 = (long)iVar16;
                  bVar14 = inrec[lVar19];
                  lVar20 = (long)(char)bVar14;
                  iVar15 = iVar16;
                  iVar12 = local_80;
                  bVar22 = bVar6;
                  if (bVar7 == 0x6a) {
                    ppuVar11 = __ctype_b_loc();
                    if ((*(byte *)((long)*ppuVar11 + lVar20 * 2 + 1) & 8) != 0) {
                      local_90 = (char)bVar14 + -0x30;
                      bVar22 = true;
                    }
                  }
                  else if (bVar7 == 0x69) {
                    ppuVar11 = __ctype_b_loc();
                    if ((*(byte *)((long)*ppuVar11 + lVar20 * 2 + 1) & 8) != 0) {
                      local_8c = (char)bVar14 + -0x30;
                      bVar22 = true;
                    }
                  }
                  else {
                    uVar9 = (uint)bVar7;
                    if (bVar7 < 0x6c) {
                      if (uVar9 == 0x23) {
LAB_00139985:
                        ppuVar11 = __ctype_b_loc();
                        if ((*(byte *)((long)*ppuVar11 + lVar20 * 2 + 1) & 8) == 0) {
                          bVar22 = false;
                        }
                        else {
                          uVar9 = 0;
                          if (iVar16 < 8) {
                            uVar9 = 0;
                            do {
                              if ((*(byte *)((long)*ppuVar11 + (long)(char)bVar14 * 2 + 1) & 8) == 0
                                 ) goto LAB_00139a00;
                              uVar9 = ((int)(char)bVar14 + uVar9 * 10) - 0x30;
                              bVar14 = inrec[lVar19 + 1];
                              lVar19 = lVar19 + 1;
                              iVar16 = iVar16 + 1;
                            } while (lVar19 != 8);
                            iVar16 = 8;
                          }
LAB_00139a00:
                          iVar15 = iVar16 + -1;
                          if ((byte)(bVar7 + 0x93) < 2) {
                            if (uVar9 - 1 < 999) {
                              bVar22 = true;
                              if (uVar9 == *colnum) {
                                iVar12 = 1;
                              }
                              else {
                                iVar12 = 2;
                                if ((uVar9 != colnum[1]) && (iVar12 = 3, uVar9 != colnum[2])) {
                                  bVar22 = uVar9 == colnum[3];
                                  iVar12 = (uint)bVar22 * 4;
                                }
                              }
                              if (bVar7 != 0x6e) {
                                local_84 = iVar12;
                                iVar12 = local_80;
                              }
                            }
                            else {
                              bVar22 = false;
                            }
                          }
                          else {
                            bVar22 = true;
                            if (bVar7 == 0x6c) {
                              local_74 = uVar9;
                            }
                          }
                        }
                      }
                      else {
                        bVar22 = true;
                        if (uVar9 != 0x3f) {
                          if (uVar9 != 0x61) goto LAB_00139a40;
                          ppuVar11 = __ctype_b_loc();
                          bVar22 = bVar6;
                          if (bVar14 == 0x20 ||
                              (*(byte *)((long)*ppuVar11 + lVar20 * 2 + 1) & 1) != 0) {
                            bVar22 = true;
                            bVar21 = bVar14;
                          }
                        }
                      }
                    }
                    else {
                      if (uVar9 - 0x6c < 3) goto LAB_00139985;
LAB_00139a40:
                      bVar22 = bVar14 == bVar7;
                    }
                  }
                  local_80 = iVar12;
                  bVar22 = !bVar22;
                  iVar16 = iVar15;
                  if (bVar22) break;
                  iVar16 = iVar15 + 1;
                  bVar7 = pbVar18[lVar17 + 1];
                  bVar5 = false;
                  if (bVar7 == 0) break;
                  lVar17 = lVar17 + 1;
                  bVar6 = true;
                } while (iVar15 < 7);
              }
              bVar7 = bVar1;
              if (!bVar22) {
                if ((7 < iVar16) || (inrec[iVar16] == ' ')) {
                  bVar4 = true;
                  break;
                }
                bVar4 = true;
              }
            }
            uVar13 = uVar13 + 1;
            local_88 = npat;
          } while (uVar13 != (uint)npat);
          bVar4 = !bVar4;
        }
        if (i != (int *)0x0) {
          *i = local_8c;
        }
        if (j != (int *)0x0) {
          *j = local_90;
        }
        if (n != (int *)0x0) {
          *n = local_80;
        }
        if (m != (int *)0x0) {
          *m = local_84;
        }
        if (l != (int *)0x0) {
          *l = local_74;
        }
        if (pat_num != (int *)0x0) {
          *pat_num = local_88;
        }
        iVar16 = 0;
        if (!bVar4) {
          pcVar3 = patterns[local_88][1];
          if (((*pcVar3 != '\0') && (iVar16 = 0, *pcVar3 != '-')) &&
             (strcpy(outrec,inrec), *pcVar3 != '+')) {
            lVar17 = 0;
            iVar16 = 0;
            do {
              cVar2 = pcVar3[lVar17];
              cVar8 = (char)local_8c;
              if ((cVar2 == 'i') || (cVar8 = (char)local_90, cVar2 == 'j')) {
                outrec[iVar16] = cVar8 + '0';
              }
              else {
                if (cVar2 == '\0') {
                  if (iVar16 < 8) {
                    memset(outrec + iVar16,0x20,(ulong)(7 - iVar16) + 1);
                  }
                  return *status;
                }
                if ((cVar2 == 'n') && (local_80 != 0)) {
                  outrec[iVar16] = (byte)local_80 | 0x30;
                }
                else if ((cVar2 == 'm') && (local_84 != 0)) {
                  outrec[iVar16] = (byte)local_84 | 0x30;
                }
                else if ((cVar2 == 'l') && (-1 < (int)local_74)) {
                  uVar9 = 1;
                  uVar10 = local_74;
                  while (0 < (int)uVar10) {
                    uVar9 = uVar9 * 10;
                    uVar10 = local_74 / uVar9;
                  }
                  if (9 < uVar9) {
                    pbVar18 = (byte *)(outrec + iVar16);
                    do {
                      uVar13 = (ulong)local_74 / ((ulong)uVar9 / 10);
                      *pbVar18 = (char)uVar13 + (char)(uVar13 / 10) * -10 | 0x30;
                      pbVar18 = pbVar18 + 1;
                      iVar16 = iVar16 + 1;
                      bVar4 = 99 < uVar9;
                      uVar9 = uVar9 / 10;
                    } while (bVar4);
                  }
                  iVar16 = iVar16 + -1;
                }
                else if (cVar2 == 'a') {
                  outrec[iVar16] = bVar21;
                }
                else {
                  outrec[iVar16] = cVar2;
                }
              }
              lVar17 = lVar17 + 1;
              iVar16 = iVar16 + 1;
            } while( true );
          }
        }
      }
    }
  }
  return iVar16;
}

Assistant:

int fits_translate_pixkeyword(
      char *inrec,        /* I - input string */
      char *outrec,       /* O - output converted string, or */
                          /*     a null string if input does not  */
                          /*     match any of the patterns */
      char *patterns[][2],/* I - pointer to input / output string */
                          /*     templates */
      int npat,           /* I - number of templates passed */
      int naxis,          /* I - number of columns to be binned */
      int *colnum,       /* I - numbers of the columns to be binned */
      int *pat_num,       /* O - matched pattern number (0 based) or -1 */
      int *i,
      int *j,
      int *n,
      int *m,
      int *l,
      int *status)        /* IO - error status */
      
/* 

Translate a keyword name to a new name, based on a set of patterns.
The user passes an array of patterns to be matched.  Input pattern
number i is pattern[i][0], and output pattern number i is
pattern[i][1].  Keywords are matched against the input patterns.  If a
match is found then the keyword is re-written according to the output
pattern.

Order is important.  The first match is accepted.  The fastest match
will be made when templates with the same first character are grouped
together.

Several characters have special meanings:

     i,j - single digits, preserved in output template
     n, m - column number of one or more digits, preserved in output template
     k - generic number of one or more digits, preserved in output template
     a - coordinate designator, preserved in output template
     # - number of one or more digits
     ? - any character
     * - only allowed in first character position, to match all
         keywords; only useful as last pattern in the list

i, j, n, and m are returned by the routine.

For example, the input pattern "iCTYPn" will match "1CTYP5" (if n_value
is 5); the output pattern "CTYPEi" will be re-written as "CTYPE1".
Notice that "i" is preserved.

The following output patterns are special

Special output pattern characters:

    "-" - do not copy a keyword that matches the corresponding input pattern

    "+" - copy the input unchanged

The inrec string could be just the 8-char keyword name, or the entire 
80-char header record.  Characters 9 = 80 in the input string simply get
appended to the translated keyword name.

If n_range = 0, then only keywords with 'n' equal to n_value will be 
considered as a pattern match.  If n_range = +1, then all values of 
'n' greater than or equal to n_value will be a match, and if -1, 
then values of 'n' less than or equal to n_value will match.

*/

{
    int i1 = 0, j1 = 0, val;
    int fac, nval = 0, mval = 0, lval = 0;
    char a = ' ';
    char oldp;
    char c, s;
    int ip, ic, pat, pass = 0, firstfail;
    char *spat;

    if (*status > 0)
        return(*status);

    if ((inrec == 0) || (outrec == 0)) 
      return (*status = NULL_INPUT_PTR);

    *outrec = '\0';
    if (*inrec == '\0') return 0;

    oldp = '\0';
    firstfail = 0;

    /* ===== Pattern match stage */
    for (pat=0; pat < npat; pat++) {

      spat = patterns[pat][0];
      
      i1 = 0; j1 = 0;   a = ' ';  /* Initialize the place-holders */
      pass = 0;
      
      /* Pass the wildcard pattern */
      if (spat[0] == '*') { 
	pass = 1;
	break;
      }
      
      /* Optimization: if we have seen this initial pattern character before,
	 then it must have failed, and we can skip the pattern */
      if (firstfail && spat[0] == oldp) continue;
      oldp = spat[0];

      /* 
	 ip = index of pattern character being matched
	 ic = index of keyname character being matched
	 firstfail = 1 if we fail on the first characteor (0=not)
      */
      
      for (ip=0, ic=0, firstfail=1;
	   (spat[ip]) && (ic < 8);
	   ip++, ic++, firstfail=0) {
	c = inrec[ic];
	s = spat[ip];

	if (s == 'i') {
	  /* Special pattern: 'i' placeholder */
	  if (isdigit(c)) { i1 = c - '0'; pass = 1;}
	} else if (s == 'j') {
	  /* Special pattern: 'j' placeholder */
	  if (isdigit(c)) { j1 = c - '0'; pass = 1;}
	} else if ((s == 'n')||(s == 'm')||(s == 'l')||(s == '#')) {
	  /* Special patterns: multi-digit number */
          val = 0;
	  pass = 0;
	  if (isdigit(c)) {
	    pass = 1;  /* NOTE, could fail below */
	    
	    /* Parse decimal number */
	    while (ic<8 && isdigit(c)) { 
	      val = val*10 + (c - '0');
	      ic++; c = inrec[ic];
	    }
	    ic--; c = inrec[ic];

	    if (s == 'n' || s == 'm') { 
	      
	      /* Is it a column number? */
	      if ( val >= 1 && val <= 999) {
	         
		 if (val == colnum[0])
		     val = 1; 
		 else if (val == colnum[1]) 
		     val = 2; 
		 else if (val == colnum[2]) 
		     val = 3; 
		 else if (val == colnum[3]) 
		     val = 4; 
		 else {
		     pass = 0;
		     val = 0; 
		 }

	         if (s == 'n')
		    nval = val;
		 else
		    mval = val;
 
              } else {
		  pass = 0;
              }
	    } else if (s == 'l') {
	      /* Generic number */
	      lval = val; 
	    }
	  }
	} else if (s == 'a') {
	  /* Special pattern: coordinate designator */
	  if (isupper(c) || c == ' ') { a = c; pass = 1;} 
	} else if (s == '?') {
	  /* Match any individual character */
	  pass = 1;
	} else if (c == s) {
	  /* Match a specific character */
	  pass = 1;
	} else {
	  /* FAIL */
	  pass = 0;
	}
	
	if (!pass) break;
      }
      

      /* Must pass to the end of the keyword.  No partial matches allowed */
      if (pass && (ic >= 8 || inrec[ic] == ' ')) break;
    }


    /* Transfer the pattern-matched numbers to the output parameters */
    if (i) { *i = i1; }
    if (j) { *j = j1; }
    if (n) { *n = nval; }
    if (m) { *m = mval; }
    if (l) { *l = lval; }
    if (pat_num) { *pat_num = pat; }

    /* ===== Keyword rewriting and output stage */
    spat = patterns[pat][1];

    /* Return case: no match, or explicit deletion pattern */
    if (pass == 0 || spat[0] == '\0' || spat[0] == '-') return 0;

    /* A match: we start by copying the input record to the output */
    strcpy(outrec, inrec);

    /* Return case: return the input record unchanged */
    if (spat[0] == '+') return 0;

    /* Final case: a new output pattern */
    for (ip=0, ic=0; spat[ip]; ip++, ic++) {
      s = spat[ip];
      if (s == 'i') {
	outrec[ic] = (i1+'0');
      } else if (s == 'j') {
	outrec[ic] = (j1+'0');
      } else if (s == 'n' && nval > 0) {
	  for (fac = 1; (nval/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((nval/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
      } else if (s == 'm' && mval > 0) {
	  for (fac = 1; (mval/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((mval/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
      } else if (s == 'l' && lval >= 0) {
	for (fac = 1; (lval/fac) > 0; fac *= 10);
	fac /= 10;
	while(fac > 0) {
	  outrec[ic] = ((lval/fac) % 10) + '0';
	  fac /= 10;
	  ic ++;
	}
	ic --;
      } else if (s == 'a') {
	outrec[ic] = a;
      } else {
	outrec[ic] = s;
      }
    }

    /* Pad the keyword name with spaces */
    for ( ; ic<8; ic++) { outrec[ic] = ' '; }

    return(*status);
}